

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PushConstantComputeTestInstance *this)

{
  VkResult VVar1;
  int iVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkQueue pVVar5;
  TestStatus *pTVar6;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> expectValue;
  VkSubmitInfo submitInfo;
  allocator_type local_b9;
  value_type local_b8;
  long local_a8 [2];
  TestStatus *local_98;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Move<vk::VkCommandBuffer_s_*> *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_98 = __return_storage_ptr__;
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar5 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  uStack_70 = 0;
  local_58 = 0;
  uStack_40 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = 0;
  local_78 = 4;
  uStack_50 = 1;
  local_48 = &this->m_cmdBuffer;
  VVar1 = (*pDVar3->_vptr_DeviceInterface[0x14])(pDVar3,pVVar4,1,&this->m_fence);
  ::vk::checkResult(VVar1,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60c);
  VVar1 = (*pDVar3->_vptr_DeviceInterface[2])
                    (pDVar3,pVVar5,1,&local_78,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60d);
  VVar1 = (*pDVar3->_vptr_DeviceInterface[0x16])
                    (pDVar3,pVVar4,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60e);
  local_b8.m_data[0] = 1.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  local_b8.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_90,8,&local_b8,&local_b9);
  iVar2 = bcmp(local_90.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               ((this->m_outBufferAlloc).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr,0x80);
  local_b8.m_data._0_8_ = local_a8;
  if (iVar2 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"result image matches with reference","");
    pTVar6 = local_98;
    local_98->m_code = QP_TEST_RESULT_PASS;
    (local_98->m_description)._M_dataplus._M_p = (pointer)&(local_98->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98->m_description,local_b8.m_data._0_8_,
               local_b8.m_data._8_8_ + local_b8.m_data._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Image mismatch","");
    pTVar6 = local_98;
    local_98->m_code = QP_TEST_RESULT_FAIL;
    (local_98->m_description)._M_dataplus._M_p = (pointer)&(local_98->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98->m_description,local_b8.m_data._0_8_,
               local_b8.m_data._8_8_ + local_b8.m_data._0_8_);
  }
  if ((long *)local_b8.m_data._0_8_ != local_a8) {
    operator_delete((void *)local_b8.m_data._0_8_,local_a8[0] + 1);
  }
  if (local_90.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar6;
}

Assistant:

tcu::TestStatus PushConstantComputeTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity*/));

	// verify result
	std::vector<tcu::Vec4>	expectValue(8, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	if (deMemCmp((void*)(&expectValue[0]), m_outBufferAlloc->getHostPtr(), (size_t)(sizeof(tcu::Vec4) * 8)))
	{
		return tcu::TestStatus::fail("Image mismatch");
	}
	return tcu::TestStatus::pass("result image matches with reference");
}